

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariable.cpp
# Opt level: O2

void __thiscall rsg::Variable::~Variable(Variable *this)

{
  std::__cxx11::string::~string((string *)&this->m_name);
  VariableType::~VariableType(&this->m_type);
  return;
}

Assistant:

Variable::~Variable (void)
{
}